

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O3

void __thiscall ipx::Basis::Basis(Basis *this,Control *control,Model *model)

{
  int dim;
  int iVar1;
  Control *control_00;
  LuUpdate *pLVar2;
  ForrestTomlin *this_00;
  BasicLu *this_01;
  _Head_base<0UL,_ipx::LuUpdate_*,_false> _Var3;
  _Head_base<0UL,_ipx::LuUpdate_*,_false> local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  this->control_ = control;
  this->model_ = model;
  local_38 = &this->basis_;
  (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->lu_)._M_t.super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
  super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
  super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl = (LuUpdate *)0x0;
  this->num_factorizations_ = 0;
  this->num_updates_ = 0;
  this->num_ftran_ = 0;
  this->num_btran_ = 0;
  this->num_ftran_sparse_ = 0;
  this->num_btran_sparse_ = 0;
  this->time_ftran_ = 0.0;
  this->time_btran_ = 0.0;
  this->time_update_ = 0.0;
  this->time_factorize_ = 0.0;
  (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fill_factors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->sum_ftran_density_ = 0.0;
  this->sum_btran_density_ = 0.0;
  dim = model->num_rows_;
  iVar1 = model->num_cols_;
  std::vector<int,_std::allocator<int>_>::resize(local_38,(long)dim);
  std::vector<int,_std::allocator<int>_>::resize(&this->map2basis_,(long)iVar1 + (long)dim);
  control_00 = this->control_;
  if ((control_00->parameters_).super_ipx_parameters.lu_kernel < 1) {
    this_01 = (BasicLu *)operator_new(0xe0);
    BasicLu::BasicLu(this_01,control_00,dim);
    _Var3._M_head_impl =
         (this->lu_)._M_t.super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>.
         _M_t.super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
         super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl;
    (this->lu_)._M_t.super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
    super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
    super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl = (LuUpdate *)this_01;
  }
  else {
    local_40._M_head_impl = (LuUpdate *)operator_new(0x10);
    *(undefined8 *)&(local_40._M_head_impl)->updates_ = 0;
    (local_40._M_head_impl)->_vptr_LuUpdate = (_func_int **)&PTR__LuFactorization_004416e8;
    this_00 = (ForrestTomlin *)operator_new(0x260);
    ForrestTomlin::ForrestTomlin
              (this_00,control_00,dim,
               (unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *)
               &local_40);
    pLVar2 = (this->lu_)._M_t.
             super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
             super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
             super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl;
    (this->lu_)._M_t.super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
    super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
    super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl = (LuUpdate *)this_00;
    _Var3._M_head_impl = local_40._M_head_impl;
    if (pLVar2 != (LuUpdate *)0x0) {
      (*pLVar2->_vptr_LuUpdate[1])();
      _Var3._M_head_impl = local_40._M_head_impl;
    }
  }
  if (_Var3._M_head_impl != (LuUpdate *)0x0) {
    (*(_Var3._M_head_impl)->_vptr_LuUpdate[1])();
  }
  LuUpdate::pivottol((this->lu_)._M_t.
                     super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
                     super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
                     super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,
                     (this->control_->parameters_).super_ipx_parameters.lu_pivottol);
  SetToSlackBasis(this);
  return;
}

Assistant:

Basis::Basis(const Control& control, const Model& model)
    : control_(control), model_(model) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    basis_.resize(m);
    map2basis_.resize(n+m);
    if (control_.lu_kernel() <= 0) {
        lu_.reset(new BasicLu(control_, m));
    } else {
        std::unique_ptr<LuFactorization> lu(new BasicLuKernel);
        lu_.reset(new ForrestTomlin(control_, m, lu));
    }
    lu_->pivottol(control_.lu_pivottol());
    SetToSlackBasis();
}